

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O0

void pzshape::TPZShapeLinear::TransformPoint1d(int transid,FADREAL *in,FADREAL *out)

{
  FadExpr<FadUnaryMin<Fad<double>_>_> *in_RDX;
  Fad<double> *in_RSI;
  int in_EDI;
  Fad<double> *in_stack_ffffffffffffffc8;
  Fad<double> *in_stack_ffffffffffffffd0;
  Fad<double> *in_stack_ffffffffffffffd8;
  
  if (in_EDI == 0) {
    Fad<double>::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    Fad<double>::operator-(in_stack_ffffffffffffffd8);
    Fad<double>::operator=(in_RSI,in_RDX);
    FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x187d707);
  }
  return;
}

Assistant:

void TPZShapeLinear::TransformPoint1d(int transid,FADREAL & in,FADREAL &out) {
		if (!transid) out =  in;
		else          out = -in;
	}